

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O2

ImageDataFunctionHeader * __thiscall
lrit::HeaderReader<lrit::ImageDataFunctionHeader>::getHeader
          (ImageDataFunctionHeader *__return_storage_ptr__,
          HeaderReader<lrit::ImageDataFunctionHeader> *this)

{
  ushort uVar1;
  int iVar2;
  
  iVar2 = this->p_;
  (this->h_).headerType =
       (this->b_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start[iVar2];
  uVar1 = *(ushort *)
           ((this->b_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start + (iVar2 + 1));
  (this->h_).headerLength = uVar1 << 8 | uVar1 >> 8;
  this->p_ = iVar2 + 3;
  ImageDataFunctionHeader::ImageDataFunctionHeader(__return_storage_ptr__,&this->h_);
  return __return_storage_ptr__;
}

Assistant:

H getHeader() {
    read(&h_.headerType);
    read(&h_.headerLength);
    return h_;
  }